

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

bool CreateSig(BaseSignatureCreator *creator,SignatureData *sigdata,SigningProvider *provider,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *sig_out,CPubKey *pubkey,
              CScript *scriptcode,SigVersion sigversion)

{
  pointer *ppCVar1;
  iterator __position;
  void *pvVar2;
  char cVar3;
  int iVar4;
  iterator iVar5;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *__args_1;
  uint extraout_EDX;
  long in_FS_OFFSET;
  KeyOriginInfo info;
  CKeyID keyid;
  uchar local_d8 [4];
  undefined1 local_b8 [80];
  pointer local_68;
  pointer puStack_60;
  pointer local_58;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::GetID((CKeyID *)&stack0xffffffffffffffb4,pubkey);
  iVar5 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::find(&(sigdata->signatures)._M_t,(CKeyID *)&stack0xffffffffffffffb4);
  if ((_Rb_tree_header *)iVar5._M_node == &(sigdata->signatures)._M_t._M_impl.super__Rb_tree_header)
  {
    iVar4 = (*provider->_vptr_SigningProvider[7])(provider,&stack0xffffffffffffffb4);
    if ((char)iVar4 != '\0') {
      memcpy((pair<CPubKey,_KeyOriginInfo> *)local_b8,pubkey,0x41);
      local_b8._72_4_ = local_d8;
      local_68 = (pointer)0x0;
      puStack_60 = (pointer)0x0;
      local_58 = (pointer)0x0;
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
      ::_M_emplace_unique<CKeyID&,std::pair<CPubKey,KeyOriginInfo>>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                  *)&sigdata->misc_pubkeys,(CKeyID *)&stack0xffffffffffffffb4,
                 (pair<CPubKey,_KeyOriginInfo> *)local_b8);
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68,(long)local_58 - (long)local_68);
      }
    }
    __args_1 = (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               &stack0xffffffffffffffb4;
    iVar4 = (*creator->_vptr_BaseSignatureCreator[3])
                      (creator,provider,sig_out,__args_1,scriptcode,(ulong)sigversion);
    cVar3 = (char)iVar4;
    if (cVar3 == '\0') {
      __position._M_current =
           (sigdata->missing_sigs).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (sigdata->missing_sigs).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CKeyID,std::allocator<CKeyID>>::_M_realloc_insert<CKeyID_const&>
                  ((vector<CKeyID,std::allocator<CKeyID>> *)&sigdata->missing_sigs,__position,
                   (CKeyID *)&stack0xffffffffffffffb4);
      }
      else {
        *(undefined4 *)
         (((__position._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10) =
             local_3c;
        *(undefined8 *)
         ((__position._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems = local_4c;
        *(undefined8 *)
         (((__position._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 8) =
             uStack_44;
        ppCVar1 = &(sigdata->missing_sigs).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
    }
    else {
      memcpy(local_b8,pubkey,0x41);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_b8 + 0x48),sig_out)
      ;
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
      ::
      _M_emplace_unique<CKeyID&,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_bool>
                  *)&sigdata->signatures,
                 (_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  *)&stack0xffffffffffffffb4,(CKeyID *)local_b8,__args_1);
      pvVar2 = (void *)CONCAT44(local_b8._76_4_,local_b8._72_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)puStack_60 - (long)pvVar2);
      }
      if ((extraout_EDX & 1) == 0) {
        __assert_fail("i.second",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                      ,0x92,
                      "bool CreateSig(const BaseSignatureCreator &, SignatureData &, const SigningProvider &, std::vector<unsigned char> &, const CPubKey &, const CScript &, SigVersion)"
                     );
      }
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (sig_out,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(iVar5._M_node + 4))
    ;
    cVar3 = '\x01';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool CreateSig(const BaseSignatureCreator& creator, SignatureData& sigdata, const SigningProvider& provider, std::vector<unsigned char>& sig_out, const CPubKey& pubkey, const CScript& scriptcode, SigVersion sigversion)
{
    CKeyID keyid = pubkey.GetID();
    const auto it = sigdata.signatures.find(keyid);
    if (it != sigdata.signatures.end()) {
        sig_out = it->second.second;
        return true;
    }
    KeyOriginInfo info;
    if (provider.GetKeyOrigin(keyid, info)) {
        sigdata.misc_pubkeys.emplace(keyid, std::make_pair(pubkey, std::move(info)));
    }
    if (creator.CreateSig(provider, sig_out, keyid, scriptcode, sigversion)) {
        auto i = sigdata.signatures.emplace(keyid, SigPair(pubkey, sig_out));
        assert(i.second);
        return true;
    }
    // Could not make signature or signature not found, add keyid to missing
    sigdata.missing_sigs.push_back(keyid);
    return false;
}